

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void aom_highbd_filter_block1d8_v8_avx2
               (uint16_t *src_ptr,ptrdiff_t src_pitch,uint16_t *dst_ptr,ptrdiff_t dst_pitch,
               uint32_t height,int16_t *filter,int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ushort uVar3;
  int in_R8D;
  byte in_stack_00000008;
  __m256i ff [4];
  __m256i max;
  __m256i res1;
  __m256i res0;
  __m256i signal [9];
  __m256i *in_stack_fffffffffffffd20;
  __m256i *in_stack_fffffffffffffd28;
  __m256i *in_stack_fffffffffffffd30;
  undefined6 in_stack_fffffffffffffd38;
  ptrdiff_t in_stack_fffffffffffffd50;
  uint16_t *in_stack_fffffffffffffd58;
  __m256i *in_stack_fffffffffffffd60;
  __m256i *in_stack_fffffffffffffd68;
  __m256i *in_stack_fffffffffffffd70;
  __m256i *in_stack_fffffffffffffdb0;
  ptrdiff_t in_stack_fffffffffffffdb8;
  int16_t *in_stack_fffffffffffffde0;
  __m256i *in_stack_fffffffffffffe10;
  ptrdiff_t in_stack_fffffffffffffe18;
  uint16_t *in_stack_fffffffffffffe20;
  int local_ac;
  uint16_t *local_80;
  __m256i *palStack_68;
  
  uVar3 = (short)(1 << (in_stack_00000008 & 0x1f)) - 1;
  auVar1 = vpinsrw_avx(ZEXT216(uVar3),(uint)uVar3,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar3,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar3,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar3,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar3,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar3,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar3,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar3),(uint)uVar3,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar3,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar3,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar3,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar3,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar3,6);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar3,7);
  local_80 = SUB168(ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2,0);
  palStack_68 = SUB168(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1,8);
  pack_filters(in_stack_fffffffffffffde0,palStack_68);
  pack_8x9_init(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  local_ac = in_R8D;
  do {
    pack_8x9_pixels(local_80,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    filter_8x9_pixels((__m256i *)CONCAT26(uVar3,in_stack_fffffffffffffd38),in_stack_fffffffffffffd30
                      ,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    store_8x2_pixels(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                     in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    update_pixels((__m256i *)&stack0xfffffffffffffe20);
    local_ac = local_ac + -2;
  } while (local_ac != 0);
  return;
}

Assistant:

static void aom_highbd_filter_block1d8_v8_avx2(
    const uint16_t *src_ptr, ptrdiff_t src_pitch, uint16_t *dst_ptr,
    ptrdiff_t dst_pitch, uint32_t height, const int16_t *filter, int bd) {
  __m256i signal[9], res0, res1;
  const __m256i max = _mm256_set1_epi16((1 << bd) - 1);

  __m256i ff[4];
  pack_filters(filter, ff);

  pack_8x9_init(src_ptr, src_pitch, signal);

  do {
    pack_8x9_pixels(src_ptr, src_pitch, signal);

    filter_8x9_pixels(signal, ff, &res0, &res1);
    store_8x2_pixels(&res0, &res1, &max, dst_ptr, dst_pitch);
    update_pixels(signal);

    src_ptr += src_pitch << 1;
    dst_ptr += dst_pitch << 1;
    height -= 2;
  } while (height > 0);
}